

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  ulong uVar2;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *r;
  
  r = this->_cursor;
  while (pMVar1 = this->_stack, r != pMVar1) {
    mpz_clear(r[-1].numeral._den._val);
    r = r + -1;
    mpz_clear((__mpz_struct *)r);
  }
  if (pMVar1 != (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    uVar2 = this->_capacity * 0x30;
    if (uVar2 == 0) {
      (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pMVar1;
    }
    else if (uVar2 < 0x11) {
      (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pMVar1;
    }
    else if (uVar2 < 0x19) {
      (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pMVar1;
    }
    else if (uVar2 < 0x21) {
      (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pMVar1;
    }
    else if (uVar2 < 0x31) {
      (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pMVar1;
    }
    else {
      if (0x40 < uVar2) {
        operator_delete(pMVar1,0x10);
        return;
      }
      (pMVar1->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      (pMVar1->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pMVar1;
    }
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }